

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase::sectionStarting
          (CumulativeReporterBase *this,SectionInfo *sectionInfo)

{
  pointer *pppSVar1;
  pointer pcVar2;
  pointer ppSVar3;
  SectionNode *pSVar4;
  iterator __position;
  _Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> ptr;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *puVar5;
  bool bVar6;
  long lVar7;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  __it;
  __normal_iterator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_*,_std::vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>_>
  __it_00;
  SectionNode *node;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> newNode;
  BySectionInfo local_d0;
  _Iter_pred<Catch::(anonymous_namespace)::BySectionInfo> local_c8;
  uint64_t local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  size_type sStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  unique_ptr<Catch::CumulativeReporterBase::SectionNode> *local_98;
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  undefined8 uStack_78;
  char *local_70;
  double dStack_68;
  uint64_t local_60;
  pointer puStack_58;
  pointer local_50;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  pcVar2 = (sectionInfo->name)._M_dataplus._M_p;
  local_c8._M_pred.m_other = (BySectionInfo)(BySectionInfo)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (sectionInfo->name)._M_string_length);
  local_a8._M_allocated_capacity = (size_type)(sectionInfo->lineInfo).file;
  local_a8._8_8_ = (sectionInfo->lineInfo).line;
  local_90._0_8_ = local_90 + 0x10;
  if (local_c8._M_pred.m_other == (BySectionInfo)&local_b8) {
    uStack_78 = sStack_b0;
  }
  else {
    local_90._0_8_ = local_c8._M_pred.m_other;
  }
  uStack_7f = uStack_b7;
  local_90[0x10] = local_b8;
  local_90._8_8_ = local_c0;
  local_c0 = 0;
  local_b8 = 0;
  local_70 = (sectionInfo->lineInfo).file;
  dStack_68 = (double)(sectionInfo->lineInfo).line;
  local_60 = 0;
  puStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  uStack_48 = 0;
  uStack_47 = 0;
  uStack_40 = 0;
  uStack_3f = 0;
  ppSVar3 = (this->m_sectionStack).
            super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start == ppSVar3) {
    local_c8._M_pred.m_other = (BySectionInfo)(BySectionInfo)&local_b8;
    if ((this->m_rootSection).m_ptr == (SectionNode *)0x0) {
      Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
                ((Detail *)&local_c8,(SectionStats *)local_90);
      ptr._M_pred.m_other = local_c8._M_pred.m_other;
      local_c8._M_pred.m_other = (BySectionInfo)(SectionInfo *)0x0;
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::reset
                (&this->m_rootSection,(SectionNode *)ptr._M_pred.m_other);
      Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr
                ((unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_c8);
    }
    local_d0.m_other = (SectionInfo *)(this->m_rootSection).m_ptr;
    goto LAB_00163e60;
  }
  pSVar4 = ppSVar3[-1];
  __it_00._M_current =
       (pSVar4->childSections).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (pSVar4->childSections).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)local_98 - (long)__it_00._M_current >> 5;
  local_c8._M_pred.m_other = (BySectionInfo)(BySectionInfo)sectionInfo;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        (&local_c8,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar6) goto LAB_00163e13;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        (&local_c8,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar6) goto LAB_00163e13;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        (&local_c8,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar6) goto LAB_00163e13;
      bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        (&local_c8,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar6) goto LAB_00163e13;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  puVar5 = local_98;
  lVar7 = (long)local_98 - (long)__it_00._M_current >> 3;
  if (lVar7 == 1) {
LAB_00163e00:
    bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                      (&local_c8,__it_00);
    __it._M_current = puVar5;
    if (bVar6) {
      __it._M_current = __it_00._M_current;
    }
  }
  else {
    __it._M_current = __it_00._M_current;
    if (lVar7 == 2) {
LAB_00163d9d:
      bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::operator()
                        (&local_c8,__it);
      if (!bVar6) {
        __it_00._M_current = __it._M_current + 1;
        goto LAB_00163e00;
      }
    }
    else {
      __it._M_current = puVar5;
      if ((lVar7 == 3) &&
         (bVar6 = __gnu_cxx::__ops::_Iter_pred<Catch::(anonymous_namespace)::BySectionInfo>::
                  operator()(&local_c8,__it_00), __it._M_current = __it_00._M_current, !bVar6)) {
        __it._M_current = __it_00._M_current + 1;
        goto LAB_00163d9d;
      }
    }
  }
LAB_00163e13:
  if (__it._M_current ==
      (pSVar4->childSections).
      super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Detail::make_unique<Catch::CumulativeReporterBase::SectionNode,Catch::SectionStats&>
              ((Detail *)&local_c8,(SectionStats *)local_90);
    local_d0 = local_c8._M_pred.m_other;
    std::
    vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>
              ((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>>>
                *)&pSVar4->childSections,
               (unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_c8);
    Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::~unique_ptr
              ((unique_ptr<Catch::CumulativeReporterBase::SectionNode> *)&local_c8);
  }
  else {
    local_d0.m_other = (SectionInfo *)(__it._M_current)->m_ptr;
  }
LAB_00163e60:
  this->m_deepestSection = (SectionNode *)local_d0.m_other;
  __position._M_current =
       (this->m_sectionStack).
       super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_sectionStack).
      super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Catch::CumulativeReporterBase::SectionNode*,std::allocator<Catch::CumulativeReporterBase::SectionNode*>>
    ::_M_realloc_insert<Catch::CumulativeReporterBase::SectionNode*const&>
              ((vector<Catch::CumulativeReporterBase::SectionNode*,std::allocator<Catch::CumulativeReporterBase::SectionNode*>>
                *)&this->m_sectionStack,__position,(SectionNode **)&local_d0);
  }
  else {
    *__position._M_current = (SectionNode *)local_d0.m_other;
    pppSVar1 = &(this->m_sectionStack).
                super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  if ((SectionNode *)local_90._0_8_ != (SectionNode *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,stack0xffffffffffffff80 + 1);
  }
  return;
}

Assistant:

void
    CumulativeReporterBase::sectionStarting( SectionInfo const& sectionInfo ) {
        // We need a copy, because SectionStats expect to take ownership
        SectionStats incompleteStats( SectionInfo(sectionInfo), Counts(), 0, false );
        SectionNode* node;
        if ( m_sectionStack.empty() ) {
            if ( !m_rootSection ) {
                m_rootSection =
                    Detail::make_unique<SectionNode>( incompleteStats );
            }
            node = m_rootSection.get();
        } else {
            SectionNode& parentNode = *m_sectionStack.back();
            auto it = std::find_if( parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
            if ( it == parentNode.childSections.end() ) {
                auto newNode =
                    Detail::make_unique<SectionNode>( incompleteStats );
                node = newNode.get();
                parentNode.childSections.push_back( CATCH_MOVE( newNode ) );
            } else {
                node = it->get();
            }
        }

        m_deepestSection = node;
        m_sectionStack.push_back( node );
    }